

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii85.cc
# Opt level: O2

int main(void)

{
  void *__buf;
  FILE *__n;
  Pl_ASCII85Decoder decode;
  Pl_StdioFile out;
  uchar buf [10000];
  
  Pl_StdioFile::Pl_StdioFile(&out,"stdout",_stdout);
  Pl_ASCII85Decoder::Pl_ASCII85Decoder(&decode,"decode",&out.super_Pipeline);
  do {
    __n = _stdin;
    __buf = (void *)fread(buf,1,10000,_stdin);
    if (__buf == (void *)0x0) break;
    Pl_ASCII85Decoder::write(&decode,(int)buf,__buf,(size_t)__n);
  } while (__buf != (void *)0x0);
  Pl_ASCII85Decoder::finish(&decode);
  Pipeline::~Pipeline(&decode.super_Pipeline);
  Pl_StdioFile::~Pl_StdioFile(&out);
  return 0;
}

Assistant:

int
main()
{
    Pl_StdioFile out("stdout", stdout);
    Pl_ASCII85Decoder decode("decode", &out);

    try {
        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}